

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student_t_dist.hpp
# Opt level: O1

result_type_conflict1 __thiscall
trng::student_t_dist<float>::icdf_(student_t_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  
  fVar2 = (float)(this->P).nu_ * 0.5;
  fVar1 = math::detail::Beta<float>(fVar2,fVar2);
  fVar1 = math::detail::inv_Beta_I<float>(x,fVar2,fVar2,fVar1);
  fVar2 = (float)(this->P).nu_ / ((1.0 - fVar1) * fVar1);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  return (fVar1 + -0.5) * fVar2;
}

Assistant:

icdf_(result_type x) const {
      const result_type t{
          math::inv_Beta_I(x, P.nu() / result_type(2), P.nu() / result_type(2))};
      return math::sqrt(P.nu() / (t * (1 - t))) * (t - result_type(1) / result_type(2));
    }